

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc.c
# Opt level: O2

void do_call(int *ip)

{
  ushort *puVar1;
  ushort **ppuVar2;
  t_proc *ptVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  long lVar7;
  
  labldef(loccnt,1);
  data_loccnt = loccnt;
  loccnt = loccnt + 3;
  if (pass == 1) {
    ppuVar2 = __ctype_b_loc();
    puVar1 = *ppuVar2;
    iVar4 = *ip;
    pcVar6 = prlnbuf + iVar4;
    while (iVar4 = iVar4 + 1, (*(byte *)((long)puVar1 + (long)*pcVar6 * 2 + 1) & 0x20) != 0) {
      *ip = iVar4;
      pcVar6 = pcVar6 + 1;
    }
    iVar4 = colsym(ip);
    if (iVar4 != 0) {
      check_eol(ip);
      ptVar3 = proc_look();
      if (ptVar3 == (t_proc *)0x0) {
        lablptr = stlook(0);
        if (lablptr == (t_symbol *)0x0) {
          pcVar6 = "Undefined destination!";
          lablptr = (t_symbol *)0x0;
          goto LAB_00111826;
        }
        iVar4 = lablptr->value;
      }
      else if (bank == ptVar3->bank) {
        iVar4 = ptVar3->org + 0xa000;
      }
      else {
        iVar4 = ptVar3->call;
        if (iVar4 == 0) {
          lVar5 = (long)call_ptr;
          iVar4 = call_ptr + 0x8000;
          ptVar3->call = iVar4;
          if (lVar5 == 0) {
            max_bank = max_bank + 1;
            call_bank = max_bank;
          }
          lVar7 = (long)call_bank;
          rom[lVar7][lVar5] = 0xa8;
          map[lVar7][lVar5] = 0x82;
          rom[lVar7][lVar5 + 1] = 'C';
          map[lVar7][lVar5 + 1] = 0x82;
          rom[lVar7][lVar5 + 2] = ' ';
          map[lVar7][lVar5 + 2] = 0x82;
          rom[lVar7][lVar5 + 3] = 'H';
          map[lVar7][lVar5 + 3] = 0x82;
          rom[lVar7][lVar5 + 4] = 0xa9;
          map[lVar7][lVar5 + 4] = 0x82;
          rom[lVar7][lVar5 + 5] = (char)bank_base + (char)ptVar3->bank;
          map[lVar7][lVar5 + 5] = 0x82;
          rom[lVar7][lVar5 + 6] = 'S';
          map[lVar7][lVar5 + 6] = 0x82;
          rom[lVar7][lVar5 + 7] = ' ';
          map[lVar7][lVar5 + 7] = 0x82;
          rom[lVar7][lVar5 + 8] = 0x98;
          map[lVar7][lVar5 + 8] = 0x82;
          rom[lVar7][lVar5 + 9] = ' ';
          map[lVar7][lVar5 + 9] = 0x82;
          rom[lVar7][lVar5 + 10] = (uchar)ptVar3->org;
          map[lVar7][lVar5 + 10] = 0x82;
          rom[lVar7][lVar5 + 0xb] = *(char *)((long)&ptVar3->org + 1) + 0xa0;
          map[lVar7][lVar5 + 0xb] = 0x82;
          rom[lVar7][lVar5 + 0xc] = 0xa8;
          map[lVar7][lVar5 + 0xc] = 0x82;
          rom[lVar7][lVar5 + 0xd] = 'h';
          map[lVar7][lVar5 + 0xd] = 0x82;
          rom[lVar7][lVar5 + 0xe] = 'S';
          map[lVar7][lVar5 + 0xe] = 0x82;
          rom[lVar7][lVar5 + 0xf] = ' ';
          map[lVar7][lVar5 + 0xf] = 0x82;
          rom[lVar7][lVar5 + 0x10] = 0x98;
          map[lVar7][lVar5 + 0x10] = 0x82;
          call_ptr = call_ptr + 0x12;
          rom[lVar7][lVar5 + 0x11] = '`';
          map[lVar7][lVar5 + 0x11] = 0x82;
        }
      }
      putbyte(data_loccnt,0x20);
      putword(data_loccnt + 1,iVar4);
      println();
      return;
    }
    if (symbol[0] == '\0') {
      pcVar6 = "Syntax error!";
LAB_00111826:
      fatal_error(pcVar6);
      return;
    }
  }
  return;
}

Assistant:

void
do_call(int *ip)
{
	struct t_proc *ptr;
	int value;

	/* define label */
	labldef(loccnt, 1);

	/* update location counter */
	data_loccnt = loccnt;
	loccnt += 3;

	/* generate code */
	if (pass == LAST_PASS) {
		/* skip spaces */
		while (isspace(prlnbuf[*ip]))
			(*ip)++;

		/* extract name */
		if (!colsym(ip)) {
			if (symbol[0] == 0)
				fatal_error("Syntax error!");
			return;
		}

		/* check end of line */
		check_eol(ip);

		/* lookup proc table */
		if((ptr = proc_look())) {
			/* check banks */
			if (bank == ptr->bank)
				value = ptr->org + 0xA000;
			else {
				/* different */
				if (ptr->call)
					value = ptr->call;
				else {
					/* new call */
					value = call_ptr + 0x8000;
					ptr->call = value;

					/* init */
					if (call_ptr == 0) {
						call_bank = ++max_bank;
					}

					/* install */
					poke(call_ptr++, 0xA8);			// tay
					poke(call_ptr++, 0x43);			// tma #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x48);			// pha
					poke(call_ptr++, 0xA9);			// lda #...
					poke(call_ptr++, ptr->bank+bank_base);
					poke(call_ptr++, 0x53);			// tam #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x98);			// tya
					poke(call_ptr++, 0x20);			// jsr ...
					poke(call_ptr++, (ptr->org & 0xFF));
					poke(call_ptr++, (ptr->org >> 8) + 0xA0);
					poke(call_ptr++, 0xA8);			// tay
					poke(call_ptr++, 0x68);			// pla
					poke(call_ptr++, 0x53);			// tam #5
					poke(call_ptr++, 0x20);
					poke(call_ptr++, 0x98);			// tya
					poke(call_ptr++, 0x60);			// rts
				}
			}
		}
		else {
			/* lookup symbol table */
			if ((lablptr = stlook(0)) == NULL) {
				fatal_error("Undefined destination!");
				return;
			}

			/* get symbol value */
			value = lablptr->value;
		}

		/* opcode */
		putbyte(data_loccnt, 0x20);
		putword(data_loccnt+1, value);

		/* output line */
		println();
	}
}